

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t wVar1;
  wchar_t y;
  wchar_t *pwVar2;
  int iVar3;
  uint uVar4;
  loc_conflict lVar5;
  ulong uVar6;
  wchar_t vcombined;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  wchar_t ac;
  wchar_t vc;
  ui_entry_combiner_funcs_conflict combiner;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t *local_60;
  wchar_t *local_58;
  ui_entry_combiner_funcs local_50;
  
  uVar7 = 7;
  if (details->alternate_color_first == false) {
    uVar7 = 0;
  }
  local_58 = auxvals;
  if (((info->ncolors < L'\a') || (info->nlabcolors < L'\a')) || (info->nsym < L'\a')) {
    __assert_fail("info->ncolors >= 7 && info->nlabcolors >= 7 && info->nsym >= 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                  ,0x2e3,
                  "void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                 );
  }
  lVar5.y = 0;
  lVar5.x = (details->value_position).x;
  uVar8 = (ulong)(uint)(details->value_position).y;
  iVar3 = ui_entry_combiner_get_funcs(info->combiner_index,&local_50);
  if (iVar3 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                  ,0x2e6,
                  "void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                 );
  }
  local_60 = label;
  if (n < L'\x01') {
    vcombined = L'd';
  }
  else {
    uVar6 = 0;
    do {
      wVar1 = vals[uVar6];
      vcombined = wVar1;
      if ((wVar1 < L'É') && (vcombined = local_58[uVar6], vcombined < L'É')) {
        vcombined = (vcombined * wVar1) / 100;
      }
      if (vcombined == L'\0') {
        uVar4 = 6;
      }
      else if (vcombined == L'\x7fffffff') {
        uVar4 = 0;
      }
      else if (vcombined == L'\x7ffffffe') {
        uVar4 = 1;
      }
      else {
        uVar4 = 4;
        if (L'P' < vcombined) {
          uVar4 = 3;
          if (L'c' < vcombined) {
            uVar4 = (uint)(vcombined != L'd') + (uint)(vcombined != L'd') * 2 + 2;
          }
        }
      }
      Term_putch(lVar5.x,(wchar_t)uVar8,info->colors[uVar4 + uVar7],info->symbols[uVar4]);
      lVar5 = loc_sum((loc_conflict)((ulong)lVar5 & 0xffffffff | uVar8 << 0x20),
                      (loc_conflict)details->position_step);
      uVar8 = (ulong)lVar5 >> 0x20;
      uVar7 = uVar7 ^ 7;
      uVar6 = uVar6 + 1;
    } while ((uint)n != uVar6);
  }
  if ((nlabel < L'\x01') && (details->show_combined != true)) {
    return;
  }
  (*local_50.vec_func)(n,vals,local_58,&local_64,&local_68);
  pwVar2 = local_60;
  if (nlabel < L'\x01') goto LAB_001e09c5;
  if (details->known_rune == true) {
    vcombined = local_64;
    if ((local_64 < L'É') && (vcombined = local_68, local_68 < L'É')) {
      vcombined = (local_68 * local_64) / 100;
    }
    if (vcombined == L'\0') {
      lVar9 = 6;
    }
    else {
      if (vcombined == L'\x7fffffff') goto LAB_001e094b;
      if (vcombined == L'\x7ffffffe') {
        lVar9 = 1;
      }
      else {
        lVar9 = 4;
        if (L'P' < vcombined) {
          lVar9 = 3;
          if (L'c' < vcombined) {
            lVar9 = (ulong)(vcombined != L'd') * 3 + 2;
          }
        }
      }
    }
  }
  else {
LAB_001e094b:
    lVar9 = 0;
  }
  wVar1 = (details->label_position).x;
  y = (details->label_position).y;
  if (details->vertical_label == true) {
    uVar8 = 1;
    if (L'\x01' < nlabel) {
      uVar8 = (ulong)(uint)nlabel;
    }
    uVar6 = 0;
    do {
      Term_putch(wVar1,y + (int)uVar6,info->label_colors[lVar9],pwVar2[uVar6]);
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  else {
    safe_queue_chars(wVar1,y,nlabel,info->label_colors[lVar9],local_60);
  }
LAB_001e09c5:
  if (details->show_combined == true) {
    show_combined_generic(info,details,vcombined,vcombined);
  }
  return;
}

Assistant:

static void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 7 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac, val = RES_LEVEL_BASE;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 7 && info->nlabcolors >= 7 &&
		info->nsym >= 7);

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	for (i = 0; i < n; ++i) {
		int effect_index;
		/* Hack - this should be rewritten without aux - NRM */
		val = RES_LEVEL_BASE;

		if (vals[i] > RES_LEVEL_MIN) {
			val = vals[i];
		} else if (auxvals[i] > RES_LEVEL_MIN) {
			val = auxvals[i];
		} else {
			val = (vals[i] * auxvals[i]) / RES_LEVEL_BASE;
		}
		effect_index = convert_fa_res_level(val);

		assert(effect_index >= 0 && effect_index < 7);
		Term_putch(p.x, p.y,
			info->colors[effect_index + color_offset],
			info->symbols[effect_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 7;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int effect_index = 0;

		if (details->known_rune) {
			/* Hack - this should be rewritten without aux - NRM */
			val = RES_LEVEL_BASE;

			if (vc > RES_LEVEL_MIN) {
				val = vc;
			} else if (ac > RES_LEVEL_MIN) {
				val = ac;
			} else {
				val = (vc * ac) / RES_LEVEL_BASE;
			}
			effect_index = convert_fa_res_level(val);

			assert(effect_index >= 0 && effect_index < 7);
		}

		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[effect_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[effect_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, val, val);
	}
}